

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O3

void do_questtxt(char *infile,char *outfile)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  byte *pbVar11;
  char *extraout_RAX;
  char *pcVar12;
  byte *pbVar13;
  char *__filename;
  msghdr *pmVar14;
  char *pcVar15;
  int *unaff_RBP;
  byte bVar16;
  char *pcVar17;
  long lVar18;
  long *plVar19;
  byte bVar20;
  char *__filename_00;
  long lVar21;
  long lVar22;
  long lVar23;
  char *unaff_R12;
  uint uVar24;
  char *unaff_R13;
  qthdr *pqVar25;
  msghdr *unaff_R15;
  char (*__s2) [3];
  char code [256];
  char acStack_3b8 [256];
  long alStack_2b8 [33];
  char *pcStack_1b0;
  char *pcStack_1a8;
  char *pcStack_1a0;
  char *pcStack_198;
  msghdr *pmStack_190;
  code *pcStack_188;
  char *pcStack_180;
  msghdr *pmStack_178;
  char *pcStack_170;
  char *pcStack_168;
  qthdr *pqStack_160;
  msghdr *pmStack_158;
  code *pcStack_150;
  int local_13c;
  char local_138 [264];
  
  pcVar17 = "r";
  pcStack_150 = (code *)0x10a7fe;
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010ad6b:
    pcStack_150 = (code *)0x10ad73;
    do_questtxt_cold_7();
  }
  else {
    pcVar17 = "w+";
    pcStack_150 = (code *)0x10a81d;
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      qt_hdr.n_hdr = 0;
      qt_line = 0;
      in_msg = '\0';
      pcStack_150 = (code *)0x10a85a;
      pcVar17 = fgets(in_line,0x50,(FILE *)ifp);
      pmVar14 = (msghdr *)outfile;
      if (pcVar17 != (char *)0x0) {
        unaff_R12 = "%s %5d";
        unaff_R13 = local_138;
        unaff_RBP = &local_13c;
        unaff_R15 = msg_hdr;
        do {
          qt_line = qt_line + 1;
          pqVar25 = (qthdr *)(ulong)(uint)qt_line;
          if ((in_line._0_4_ & 0xff) != 0x23) {
            if ((in_line._0_4_ & 0xff) == 0x25) {
              uVar4 = (uint)in_line._0_4_ >> 8 & 0xff;
              if (uVar4 == 0x45) {
                local_13c = 0;
                if (in_msg == '\0') {
                  pcVar17 = "End record encountered before message - line %d\n";
LAB_0010aa8b:
                  local_13c = 0;
                  pcStack_150 = (code *)0x10aa95;
                  fprintf(_stderr,pcVar17,(ulong)(uint)qt_line);
                }
                else {
                  in_msg = '\0';
                }
              }
              else {
                if (uVar4 != 0x43) goto LAB_0010a9e7;
                local_13c = 0;
                if (in_msg != '\0') {
                  pcVar17 = "Control record encountered during message - line %d\n";
                  goto LAB_0010aa8b;
                }
                in_msg = '\x01';
                pcStack_150 = (code *)0x10a8f8;
                iVar5 = __isoc99_sscanf(in_line + 4,"%s %5d",unaff_R13,unaff_RBP);
                if (iVar5 == 2) {
                  pcStack_150 = (code *)0x10a909;
                  iVar5 = get_hdr(unaff_R13);
                  if (iVar5 == 0) {
                    if (0xf < (long)qt_hdr.n_hdr) {
                      pcStack_150 = (code *)0x10aab1;
                      do_questtxt_cold_4();
                      goto LAB_0010aa48;
                    }
                    pqVar25 = &qt_hdr;
                    pcStack_150 = (code *)0x10a93e;
                    strncpy(qt_hdr.id[qt_hdr.n_hdr],unaff_R13,3);
                    lVar8 = (long)qt_hdr.n_hdr;
                    msg_hdr[lVar8].n_msg = 0;
                    qt_hdr.n_hdr = qt_hdr.n_hdr + 1;
                    qt_hdr.offset[lVar8] = 0;
                  }
                  pcStack_150 = (code *)0x10a96e;
                  iVar5 = get_hdr(unaff_R13);
                  lVar8 = (long)(iVar5 + -1);
                  lVar9 = lVar8 * 0x2ee8 + 0x1203f8;
                  iVar5 = msg_hdr[lVar8].n_msg;
                  lVar18 = (long)iVar5;
                  if (0 < lVar18) {
                    lVar21 = 0;
                    do {
                      if (*(int *)(lVar9 + lVar21) == local_13c) {
                        pcStack_150 = (code *)0x10aaa3;
                        do_questtxt_cold_3();
                        goto LAB_0010aa48;
                      }
                      lVar21 = lVar21 + 0x18;
                    } while (lVar18 * 0x18 != lVar21);
                    if (499 < iVar5) {
                      pcStack_150 = (code *)0x10aaaa;
                      do_questtxt_cold_2();
                      goto LAB_0010aa48;
                    }
                  }
                  msg_hdr[lVar8].n_msg = iVar5 + 1;
                  curr_msg = (qtmsg *)(lVar9 + lVar18 * 0x18);
                  curr_msg->msgnum = local_13c;
                  curr_msg->delivery = in_line[2];
                  curr_msg->offset = 0;
                  curr_msg->size = 0;
                }
                else {
                  pcStack_150 = (code *)0x10aa9c;
                  do_questtxt_cold_1();
                }
              }
            }
            else {
LAB_0010a9e7:
              if (in_msg == '\0') {
                pcStack_150 = (code *)0x10aa0d;
                sVar10 = strlen(in_line);
                if (sVar10 == 1) goto LAB_0010aa48;
                pcStack_150 = (code *)0x10aa2e;
                fprintf(_stderr,"Text encountered outside message - line %d\n",pqVar25);
              }
              pcStack_150 = (code *)0x10a9f8;
              sVar10 = strlen(in_line);
              curr_msg->size = curr_msg->size + sVar10;
            }
          }
LAB_0010aa48:
          pcStack_150 = (code *)0x10aa5c;
          pcVar17 = fgets(in_line,0x50,(FILE *)ifp);
          pmVar14 = (msghdr *)in_line;
          infile = (char *)pqVar25;
        } while (pcVar17 != (char *)0x0);
      }
      pcStack_150 = (code *)0x10aac3;
      fseek((FILE *)ifp,0,0);
      in_msg = '\0';
      lVar8 = (long)qt_hdr.n_hdr;
      if (0 < lVar8) {
        plVar19 = qt_hdr.offset;
        lVar9 = lVar8 * 0xb + 4;
        lVar18 = 0;
        do {
          *plVar19 = lVar9;
          lVar9 = lVar9 + (long)*(int *)((long)msg_hdr[0].qt_msg + lVar18 + -8) * 0x18 + 4;
          lVar18 = lVar18 + 0x2ee8;
          plVar19 = plVar19 + 1;
        } while (lVar8 * 0x2ee8 - lVar18 != 0);
        lVar18 = 0x120408;
        lVar21 = 0;
        lVar22 = 0;
        do {
          iVar5 = msg_hdr[lVar21].n_msg;
          if (0 < (long)iVar5) {
            lVar23 = 0;
            do {
              *(long *)(lVar18 + -8 + lVar23) = lVar22 + lVar9;
              lVar22 = lVar22 + *(long *)(lVar18 + lVar23);
              lVar23 = lVar23 + 0x18;
            } while ((long)iVar5 * 0x18 != lVar23);
          }
          lVar21 = lVar21 + 1;
          lVar18 = lVar18 + 0x2ee8;
        } while (lVar21 != lVar8);
      }
      pcVar17 = (char *)0x4;
      pcStack_150 = (code *)0x10ab8a;
      sVar10 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
      if ((int)sVar10 == 1) {
        pcVar17 = (char *)0x3;
        pcStack_150 = (code *)0x10abb2;
        sVar10 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp);
        if (qt_hdr.n_hdr == (int)sVar10) {
          pcVar17 = (char *)0x8;
          pcStack_150 = (code *)0x10abd9;
          sVar10 = fwrite(qt_hdr.offset,8,(long)(int)sVar10,(FILE *)ofp);
          if (qt_hdr.n_hdr == (int)sVar10) {
            if (0 < (int)sVar10) {
              pmVar14 = msg_hdr;
              infile = (char *)0x0;
              do {
                pcVar17 = (char *)0x4;
                pcStack_150 = (code *)0x10ac0c;
                sVar10 = fwrite(pmVar14,4,1,(FILE *)ofp);
                if ((int)sVar10 != 1) goto LAB_0010ad66;
                pcVar17 = (char *)0x18;
                pcStack_150 = (code *)0x10ac2d;
                sVar10 = fwrite(pmVar14->qt_msg,0x18,(long)pmVar14->n_msg,(FILE *)ofp);
                if (pmVar14->n_msg != (int)sVar10) goto LAB_0010ad66;
                infile = (char *)((long)&((qthdr *)infile)->n_hdr + 1);
                pmVar14 = pmVar14 + 1;
              } while ((long)infile < (long)qt_hdr.n_hdr);
            }
            pcStack_150 = (code *)0x10ac63;
            pcVar17 = fgets(in_line,0x50,(FILE *)ifp);
            uVar4 = in_line._0_4_;
            do {
              in_line._0_4_ = uVar4;
              if (pcVar17 == (char *)0x0) {
                pcStack_150 = (code *)0x10ad48;
                fclose((FILE *)ifp);
                pcStack_150 = (code *)0x10ad54;
                fclose((FILE *)ofp);
                return;
              }
              uVar24 = uVar4 & 0xff;
              if (uVar24 != 0x23) {
                if ((uVar24 == 0x25) &&
                   ((uVar6 = uVar4 >> 8 & 0xff, uVar6 == 0x45 || (uVar6 == 0x43)))) {
                  in_msg = (char)(uVar4 >> 8) == 'C';
                }
                else {
                  if (in_msg == '\0') {
                    pcStack_150 = (code *)0x10acce;
                    sVar10 = strlen(in_line);
                    if (sVar10 == 1) goto LAB_0010ad1f;
                  }
                  pbVar11 = &xcrypt_buf;
                  if ((char)uVar4 != '\0') {
                    iVar5 = 1;
                    pcVar17 = in_line;
                    pbVar11 = &xcrypt_buf;
                    do {
                      pcVar17 = (char *)((byte *)pcVar17 + 1);
                      bVar16 = (byte)iVar5;
                      if ((uVar24 & 0x60) == 0) {
                        bVar16 = 0;
                      }
                      *pbVar11 = bVar16 ^ (byte)uVar24;
                      iVar5 = iVar5 * 2;
                      if (0x1f < iVar5) {
                        iVar5 = 1;
                      }
                      pbVar11 = pbVar11 + 1;
                      uVar24 = (uint)(byte)*pcVar17;
                    } while (*pcVar17 != 0);
                  }
                  *pbVar11 = 0;
                  pcStack_150 = (code *)0x10ad1f;
                  fputs(&xcrypt_buf,(FILE *)ofp);
                }
              }
LAB_0010ad1f:
              pcStack_150 = (code *)0x10ad33;
              pcVar17 = fgets(in_line,0x50,(FILE *)ifp);
              uVar4 = in_line._0_4_;
            } while( true );
          }
        }
      }
LAB_0010ad66:
      pcStack_150 = (code *)0x10ad6b;
      do_questtxt_cold_5();
      outfile = (char *)pmVar14;
      goto LAB_0010ad6b;
    }
  }
  pcStack_150 = do_rumors;
  pmVar14 = (msghdr *)outfile;
  do_questtxt_cold_6();
  pcStack_188 = (code *)0x10ad9e;
  pcStack_180 = extraout_RAX;
  pmStack_178 = (msghdr *)outfile;
  pcStack_170 = unaff_R12;
  pcStack_168 = unaff_R13;
  pqStack_160 = (qthdr *)infile;
  pmStack_158 = unaff_R15;
  pcStack_150 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(__filename,"w+");
  pcVar15 = __filename;
  if ((FILE *)ofp == (FILE *)0x0) {
    pcStack_188 = (code *)0x10afca;
    do_rumors_cold_3();
LAB_0010afca:
    pcStack_188 = (code *)0x10afd6;
    do_rumors_cold_2();
  }
  else {
    pcStack_188 = (code *)0x10adc1;
    pcStack_180 = __filename;
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    pcStack_188 = (code *)0x10add0;
    ifp = (FILE *)fopen((char *)pmVar14,"r");
    if ((FILE *)ifp == (FILE *)0x0) goto LAB_0010afca;
    unaff_R13 = (char *)0x0;
    pcStack_188 = (code *)0x10adf2;
    fseek((FILE *)ifp,0,2);
    pcStack_188 = (code *)0x10adfe;
    lVar8 = ftell((FILE *)ifp);
    pcStack_188 = (code *)0x10ae16;
    fprintf((FILE *)ofp,"%06lx\n",lVar8);
    pcStack_188 = (code *)0x10ae26;
    fseek((FILE *)ifp,0,0);
    pcStack_188 = (code *)0x10ae3e;
    pcVar12 = fgets(in_line,0x100,(FILE *)ifp);
    if (pcVar12 != (char *)0x0) {
      pmVar14 = (msghdr *)&xcrypt_buf;
      unaff_R12 = in_line;
      unaff_RBP = (int *)(in_line + 1);
      pcVar15 = (char *)0x1;
      do {
        pbVar11 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar5 = 1;
          pcVar12 = in_line;
          pbVar11 = &xcrypt_buf;
          bVar16 = in_line[0];
          do {
            pcVar12 = (char *)((byte *)pcVar12 + 1);
            bVar20 = (byte)iVar5;
            if ((bVar16 & 0x60) == 0) {
              bVar20 = 0;
            }
            *pbVar11 = bVar20 ^ bVar16;
            iVar5 = iVar5 * 2;
            if (0x1f < iVar5) {
              iVar5 = 1;
            }
            pbVar11 = pbVar11 + 1;
            bVar16 = *pcVar12;
          } while (bVar16 != 0);
        }
        *pbVar11 = 0;
        pcStack_188 = (code *)0x10aeb3;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_188 = (code *)0x10aec7;
        pcVar12 = fgets(in_line,0x100,(FILE *)ifp);
      } while (pcVar12 != (char *)0x0);
    }
    pcStack_188 = (code *)0x10aed8;
    fclose((FILE *)ifp);
    pcStack_188 = (code *)0x10aee7;
    ifp = (FILE *)fopen(pcVar17,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      pcStack_188 = (code *)0x10af0b;
      pcVar17 = fgets(in_line,0x100,(FILE *)ifp);
      while (pcVar17 != (char *)0x0) {
        pbVar11 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar5 = 1;
          pcVar17 = in_line;
          pbVar11 = &xcrypt_buf;
          bVar16 = in_line[0];
          do {
            pcVar17 = (char *)((byte *)pcVar17 + 1);
            bVar20 = (byte)iVar5;
            if ((bVar16 & 0x60) == 0) {
              bVar20 = 0;
            }
            *pbVar11 = bVar20 ^ bVar16;
            iVar5 = iVar5 * 2;
            if (0x1f < iVar5) {
              iVar5 = 1;
            }
            pbVar11 = pbVar11 + 1;
            bVar16 = *pcVar17;
          } while (bVar16 != 0);
        }
        *pbVar11 = 0;
        pcStack_188 = (code *)0x10af83;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_188 = (code *)0x10af97;
        pcVar17 = fgets(in_line,0x100,(FILE *)ifp);
      }
      pcStack_188 = (code *)0x10afa8;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_188 = do_oracles;
  pcVar12 = pcStack_180;
  __filename_00 = pcVar17;
  do_rumors_cold_1();
  pcStack_1b0 = pcVar15;
  pcStack_1a8 = unaff_R12;
  pcStack_1a0 = unaff_R13;
  pcStack_198 = pcVar17;
  pmStack_190 = pmVar14;
  pcStack_188 = (code *)unaff_RBP;
  sprintf(acStack_3b8,"%s.%s",pcVar12,"tmp");
  ifp = (FILE *)fopen(__filename_00,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b4f3:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(pcVar12,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(acStack_3b8,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar8 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar8);
        lVar8 = 0;
        do {
          pbVar11 = (byte *)special_oracle[lVar8];
          bVar16 = *pbVar11;
          pbVar13 = &xcrypt_buf;
          if (bVar16 != 0) {
            iVar5 = 1;
            pbVar13 = &xcrypt_buf;
            do {
              pbVar11 = pbVar11 + 1;
              bVar20 = (byte)iVar5;
              if ((bVar16 & 0x60) == 0) {
                bVar20 = 0;
              }
              *pbVar13 = bVar20 ^ bVar16;
              iVar5 = iVar5 * 2;
              if (0x1f < iVar5) {
                iVar5 = 1;
              }
              pbVar13 = pbVar13 + 1;
              bVar16 = *pbVar11;
            } while (bVar16 != 0);
          }
          *pbVar13 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar8 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar8);
        uVar4 = 1;
LAB_0010b1ac:
        bVar2 = true;
LAB_0010b1af:
        while (pcVar17 = fgets(in_line,0x100,(FILE *)ifp), pcVar17 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",alStack_2b8);
            if (in_line[4] == '-' && in_line._0_4_ == 0x2d2d2d2d) goto code_r0x0010b1fb;
            pbVar11 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar5 = 1;
              pcVar17 = in_line;
              pbVar11 = &xcrypt_buf;
              bVar16 = in_line[0];
              do {
                pcVar17 = (char *)((byte *)pcVar17 + 1);
                bVar20 = (byte)iVar5;
                if ((bVar16 & 0x60) == 0) {
                  bVar20 = 0;
                }
                *pbVar11 = bVar20 ^ bVar16;
                iVar5 = iVar5 * 2;
                if (0x1f < iVar5) {
                  iVar5 = 1;
                }
                pbVar11 = pbVar11 + 1;
                bVar16 = *pcVar17;
              } while (bVar16 != 0);
            }
            *pbVar11 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar2 = false;
          }
        }
        if (!bVar2) {
          uVar4 = uVar4 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar3 = ofp;
          lVar8 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar3,"%05lx\n",lVar8);
        }
        lVar8 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",acStack_3b8);
        iVar5 = fseek((FILE *)tfp,0,0);
        if (iVar5 == 0) {
          pcVar17 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar17 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar17 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(acStack_3b8);
          sprintf(in_line,"rewind of \"%s\"",pcVar12);
          iVar5 = fseek((FILE *)ofp,0,0);
          if (iVar5 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",pcVar12);
            iVar5 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar4);
            if (-1 < iVar5) {
              sprintf(in_line,"data rewrite of \"%s\"",pcVar12);
              iVar5 = uVar4 + 1;
              while ((((lVar9 = ftell((FILE *)ofp), -1 < lVar9 &&
                       (iVar7 = fseek((FILE *)ofp,lVar9,0), -1 < iVar7)) &&
                      (iVar7 = __isoc99_fscanf(ofp,"%5lx",alStack_2b8), iVar7 == 1)) &&
                     ((iVar7 = fseek((FILE *)ofp,lVar9,0), -1 < iVar7 &&
                      (iVar7 = fprintf((FILE *)ofp,"%05lx\n",alStack_2b8[0] + lVar8), -1 < iVar7))))
                    ) {
                iVar5 = iVar5 + -1;
                if (iVar5 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b4f3;
      }
      goto LAB_0010b503;
    }
  }
  do_oracles_cold_3();
LAB_0010b503:
  pcVar17 = acStack_3b8;
  do_oracles_cold_2();
  lVar8 = (long)qt_hdr.n_hdr;
  if (0 < lVar8) {
    __s2 = qt_hdr.id;
    lVar9 = 0;
    do {
      iVar5 = strncmp(pcVar17,*__s2,3);
      if (iVar5 == 0) {
        return;
      }
      lVar9 = lVar9 + 1;
      __s2 = __s2 + 1;
    } while (lVar8 != lVar9);
  }
  return;
code_r0x0010b1fb:
  bVar1 = !bVar2;
  bVar2 = true;
  if (bVar1) goto LAB_0010b276;
  goto LAB_0010b1af;
LAB_0010b276:
  uVar4 = uVar4 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar3 = ofp;
  lVar8 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar3,"%05lx\n",lVar8);
  goto LAB_0010b1ac;
}

Assistant:

void do_questtxt(const char *infile, const char *outfile)
{
	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}

	if (!(ofp = fopen(outfile, WRBMODE))) {
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}

	qt_hdr.n_hdr = 0;
	qt_line = 0;
	in_msg = FALSE;

	while (fgets(in_line, 80, ifp) != 0) {
	    qt_line++;
	    if (qt_control(in_line)) do_qt_control(in_line);
	    else if (qt_comment(in_line)) continue;
	    else		    do_qt_text(in_line);
	}

	rewind(ifp);
	in_msg = FALSE;
	adjust_qt_hdrs();
	put_qt_hdrs();
	while (fgets(in_line, 80, ifp) != 0) {

		if (qt_control(in_line)) {
		    in_msg = (in_line[1] == 'C');
		    continue;
		} else if (qt_comment(in_line)) continue;
#ifdef DEBUG
		fprintf(stderr, "%ld: %s", ftell(stdout), in_line);
#endif
		fputs(xcrypt(in_line), ofp);
	}
	fclose(ifp);
	fclose(ofp);
	return;
}